

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O1

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::error
          (BuildSystemFrontendDelegate *this,Twine *message)

{
  string local_68;
  undefined8 local_48;
  undefined4 local_40;
  Twine local_38;
  
  local_48 = 0;
  local_40 = 0;
  llvm::Twine::str_abi_cxx11_(&local_68,message);
  llvm::Twine::Twine(&local_38,&local_68);
  (*(this->super_BuildSystemDelegate)._vptr_BuildSystemDelegate[3])(this,"",0,&local_48,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
BuildSystemFrontendDelegate::error(const Twine& message) {
  error("", {}, message.str());
}